

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

bool __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_bool
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  json_runtime_error<std::domain_error,_void> *this_00;
  string local_38;
  
  do {
    switch(*(byte *)&((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_> &
           0xf) {
    case 1:
      return (bool)*(undefined1 *)
                    ((long)&(((pointer)this)->
                            super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_ + 2
                    );
    case 2:
    case 3:
      return *(long *)&(((pointer)this)->
                       super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8 != 0;
    default:
      this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Not a bool","");
      json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_38);
      __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
                  json_runtime_error<std::domain_error,_void>::~json_runtime_error);
    case 8:
    case 9:
      this = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             (((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                *)&((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>)->
             byte_str_).ptr_;
    }
  } while( true );
}

Assistant:

bool as_bool() const 
        {
            switch (storage_kind())
            {
                case json_storage_kind::boolean:
                    return cast<bool_storage>().value();
                case json_storage_kind::int64:
                    return cast<int64_storage>().value() != 0;
                case json_storage_kind::uint64:
                    return cast<uint64_storage>().value() != 0;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().as_bool();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().as_bool();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not a bool"));
            }
        }